

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts3Init(sqlite3 *db)

{
  void *pvVar1;
  sqlite3_tokenizer_module *local_40;
  sqlite3_tokenizer_module *pUnicode;
  sqlite3_tokenizer_module *pPorter;
  sqlite3_tokenizer_module *pSimple;
  Fts3Hash *pHash;
  sqlite3 *psStack_18;
  int rc;
  sqlite3 *db_local;
  
  pHash._4_4_ = 0;
  pSimple = (sqlite3_tokenizer_module *)0x0;
  pPorter = (sqlite3_tokenizer_module *)0x0;
  pUnicode = (sqlite3_tokenizer_module *)0x0;
  local_40 = (sqlite3_tokenizer_module *)0x0;
  psStack_18 = db;
  sqlite3Fts3UnicodeTokenizer(&local_40);
  pHash._4_4_ = sqlite3Fts3InitAux(psStack_18);
  db_local._4_4_ = pHash._4_4_;
  if (pHash._4_4_ == 0) {
    sqlite3Fts3SimpleTokenizerModule(&pPorter);
    sqlite3Fts3PorterTokenizerModule(&pUnicode);
    pSimple = (sqlite3_tokenizer_module *)sqlite3_malloc(0x20);
    if (pSimple == (sqlite3_tokenizer_module *)0x0) {
      pHash._4_4_ = 7;
    }
    else {
      sqlite3Fts3HashInit((Fts3Hash *)pSimple,'\x01','\x01');
    }
    if ((pHash._4_4_ == 0) &&
       (((pvVar1 = sqlite3Fts3HashInsert((Fts3Hash *)pSimple,"simple",7,pPorter),
         pvVar1 != (void *)0x0 ||
         (pvVar1 = sqlite3Fts3HashInsert((Fts3Hash *)pSimple,"porter",7,pUnicode),
         pvVar1 != (void *)0x0)) ||
        (pvVar1 = sqlite3Fts3HashInsert((Fts3Hash *)pSimple,"unicode61",10,local_40),
        pvVar1 != (void *)0x0)))) {
      pHash._4_4_ = 7;
    }
    if (((((pHash._4_4_ == 0) &&
          (pHash._4_4_ = sqlite3Fts3InitHashTable(psStack_18,(Fts3Hash *)pSimple,"fts3_tokenizer"),
          pHash._4_4_ == 0)) &&
         ((pHash._4_4_ = sqlite3_overload_function(psStack_18,"snippet",-1), pHash._4_4_ == 0 &&
          ((pHash._4_4_ = sqlite3_overload_function(psStack_18,"offsets",1), pHash._4_4_ == 0 &&
           (pHash._4_4_ = sqlite3_overload_function(psStack_18,"matchinfo",1), pHash._4_4_ == 0)))))
         ) && (pHash._4_4_ = sqlite3_overload_function(psStack_18,"matchinfo",2), pHash._4_4_ == 0))
       && (pHash._4_4_ = sqlite3_overload_function(psStack_18,"optimize",1), pHash._4_4_ == 0)) {
      pHash._4_4_ = sqlite3_create_module_v2(psStack_18,"fts3",&fts3Module,pSimple,hashDestroy);
      if (pHash._4_4_ == 0) {
        pHash._4_4_ = sqlite3_create_module_v2
                                (psStack_18,"fts4",&fts3Module,pSimple,(_func_void_void_ptr *)0x0);
      }
      if (pHash._4_4_ == 0) {
        pHash._4_4_ = sqlite3Fts3InitTok(psStack_18,(Fts3Hash *)pSimple);
      }
      db_local._4_4_ = pHash._4_4_;
    }
    else {
      if (pSimple != (sqlite3_tokenizer_module *)0x0) {
        sqlite3Fts3HashClear((Fts3Hash *)pSimple);
        sqlite3_free(pSimple);
      }
      db_local._4_4_ = pHash._4_4_;
    }
  }
  return db_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3Init(sqlite3 *db){
  int rc = SQLITE_OK;
  Fts3Hash *pHash = 0;
  const sqlite3_tokenizer_module *pSimple = 0;
  const sqlite3_tokenizer_module *pPorter = 0;
#ifndef SQLITE_DISABLE_FTS3_UNICODE
  const sqlite3_tokenizer_module *pUnicode = 0;
#endif

#ifdef SQLITE_ENABLE_ICU
  const sqlite3_tokenizer_module *pIcu = 0;
  sqlite3Fts3IcuTokenizerModule(&pIcu);
#endif

#ifndef SQLITE_DISABLE_FTS3_UNICODE
  sqlite3Fts3UnicodeTokenizer(&pUnicode);
#endif

#ifdef SQLITE_TEST
  rc = sqlite3Fts3InitTerm(db);
  if( rc!=SQLITE_OK ) return rc;
#endif

  rc = sqlite3Fts3InitAux(db);
  if( rc!=SQLITE_OK ) return rc;

  sqlite3Fts3SimpleTokenizerModule(&pSimple);
  sqlite3Fts3PorterTokenizerModule(&pPorter);

  /* Allocate and initialize the hash-table used to store tokenizers. */
  pHash = sqlite3_malloc(sizeof(Fts3Hash));
  if( !pHash ){
    rc = SQLITE_NOMEM;
  }else{
    sqlite3Fts3HashInit(pHash, FTS3_HASH_STRING, 1);
  }

  /* Load the built-in tokenizers into the hash table */
  if( rc==SQLITE_OK ){
    if( sqlite3Fts3HashInsert(pHash, "simple", 7, (void *)pSimple)
     || sqlite3Fts3HashInsert(pHash, "porter", 7, (void *)pPorter) 

#ifndef SQLITE_DISABLE_FTS3_UNICODE
     || sqlite3Fts3HashInsert(pHash, "unicode61", 10, (void *)pUnicode) 
#endif
#ifdef SQLITE_ENABLE_ICU
     || (pIcu && sqlite3Fts3HashInsert(pHash, "icu", 4, (void *)pIcu))
#endif
    ){
      rc = SQLITE_NOMEM;
    }
  }

#ifdef SQLITE_TEST
  if( rc==SQLITE_OK ){
    rc = sqlite3Fts3ExprInitTestInterface(db, pHash);
  }
#endif

  /* Create the virtual table wrapper around the hash-table and overload 
  ** the four scalar functions. If this is successful, register the
  ** module with sqlite.
  */
  if( SQLITE_OK==rc 
   && SQLITE_OK==(rc = sqlite3Fts3InitHashTable(db, pHash, "fts3_tokenizer"))
   && SQLITE_OK==(rc = sqlite3_overload_function(db, "snippet", -1))
   && SQLITE_OK==(rc = sqlite3_overload_function(db, "offsets", 1))
   && SQLITE_OK==(rc = sqlite3_overload_function(db, "matchinfo", 1))
   && SQLITE_OK==(rc = sqlite3_overload_function(db, "matchinfo", 2))
   && SQLITE_OK==(rc = sqlite3_overload_function(db, "optimize", 1))
  ){
    rc = sqlite3_create_module_v2(
        db, "fts3", &fts3Module, (void *)pHash, hashDestroy
    );
    if( rc==SQLITE_OK ){
      rc = sqlite3_create_module_v2(
          db, "fts4", &fts3Module, (void *)pHash, 0
      );
    }
    if( rc==SQLITE_OK ){
      rc = sqlite3Fts3InitTok(db, (void *)pHash);
    }
    return rc;
  }


  /* An error has occurred. Delete the hash table and return the error code. */
  assert( rc!=SQLITE_OK );
  if( pHash ){
    sqlite3Fts3HashClear(pHash);
    sqlite3_free(pHash);
  }
  return rc;
}